

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetSuccessorJAHI(PlanningUnitMADPDiscrete *this,Index jahI,Index joI)

{
  Index IVar1;
  Index IVar2;
  int iVar3;
  JointActionHistoryTree *this_00;
  TreeNode<JointActionHistory> *this_01;
  LIndex i;
  E *this_02;
  
  if ((this->_m_params)._m_jointActionHistories == true) {
    this_00 = GetJointActionHistoryTree(this,jahI);
    this_01 = TreeNode<JointActionHistory>::GetSuccessor(this_00,(ulong)joI);
    i = TreeNode<JointActionHistory>::GetIndex(this_01);
    IVar1 = Globals::CastLIndexToIndex(i);
    return IVar1;
  }
  IVar1 = GetTimeStepForJAHI(this,jahI);
  if ((ulong)IVar1 < (this->super_PlanningUnit)._m_horizon - 1) {
    IVar2 = Globals::CastLIndexToIndex
                      ((this->_m_firstJAHIforT).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[IVar1]);
    iVar3 = (**(code **)((long)*this->_m_madp + 0x68))();
    IVar1 = Globals::CastLIndexToIndex
                      ((this->_m_firstJAHIforT).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[IVar1 + 1]);
    return IVar1 + joI + iVar3 * (jahI - IVar2);
  }
  this_02 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_02,"taking successor of last time step joint action history");
  __cxa_throw(this_02,&E::typeinfo,E::~E);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetSuccessorJAHI(Index jahI, Index joI) const
{
    if(_m_params.GetComputeJointActionHistories())
        return(CastLIndexToIndex(GetJointActionHistoryTree(jahI)->GetSuccessor(joI)->
                                 GetIndex()));

    Index t = GetTimeStepForJAHI(jahI);
    if(t >= GetHorizon() - 1)
        throw E("taking successor of last time step joint action history");
    //Index jahI Without Offset:
    Index jahI_wo = jahI - CastLIndexToIndex(_m_firstJAHIforT[t]);
    //jahI_wo   = |jo|^t * joI(0) +...+ |jo|^0 * joI(t)
    //jahIsuc_wo= |jo^|^(t+1) *joI(0) +...+ |jo|^1 * joI(t) + |jo|^0 * joI(t+1)
    //therefore the index of the successor (without offset) is:
    Index jahIsuc_wo = jahI_wo * GetNrJointActions() + joI;
    return(jahIsuc_wo + CastLIndexToIndex(_m_firstJAHIforT[t+1]));
}